

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool AdditionHelper<unsigned_char,_short,_5>::Addition(uchar *lhs,short *rhs,uchar *result)

{
  byte bVar1;
  int iVar2;
  undefined1 *in_RDX;
  short *in_RSI;
  byte *in_RDI;
  int32_t tmp;
  
  iVar2 = (uint)*in_RDI + (int)*in_RSI;
  bVar1 = std::numeric_limits<unsigned_char>::max();
  if ((iVar2 <= (int)(uint)bVar1) &&
     (bVar1 = std::numeric_limits<unsigned_char>::min(), (int)(uint)bVar1 <= iVar2)) {
    *in_RDX = (char)iVar2;
    return true;
  }
  return false;
}

Assistant:

static bool Addition( const T& lhs, const U& rhs, T& result ) SAFEINT_NOTHROW
    {
        // 16-bit or less - one or both are signed
        std::int32_t tmp = lhs + rhs;

        if( tmp <= (std::int32_t)std::numeric_limits<T>::max() && tmp >= (std::int32_t)std::numeric_limits<T>::min() )
        {
            result = (T)tmp;
            return true;
        }

        return false;
    }